

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

void Abc_NtkMiterPrepare(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtkMiter,int fComb,
                        int nPartSize,int fMulti)

{
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  long lVar8;
  
  pAVar2 = Abc_AigConst1(pNtkMiter);
  pAVar3 = Abc_AigConst1(pNtk1);
  (pAVar3->field_6).pCopy = pAVar2;
  pAVar2 = Abc_AigConst1(pNtkMiter);
  pAVar3 = Abc_AigConst1(pNtk2);
  (pAVar3->field_6).pCopy = pAVar2;
  if (fComb == 0) {
    pVVar6 = pNtk1->vPis;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pvVar1 = pVVar6->pArray[lVar8];
        pAVar2 = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PI);
        *(Abc_Obj_t **)((long)pvVar1 + 0x40) = pAVar2;
        if (pNtk2->vPis->nSize <= lVar8) goto LAB_002d77f5;
        pAVar3 = (Abc_Obj_t *)pNtk2->vPis->pArray[lVar8];
        (pAVar3->field_6).pCopy = pAVar2;
        pcVar4 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk1->vPis;
      } while (lVar8 < pVVar6->nSize);
    }
    if (nPartSize < 1) {
      if (fMulti == 0) {
        pAVar2 = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PO);
        Abc_ObjAssignName(pAVar2,"miter",(char *)0x0);
      }
      else if (0 < pNtk1->vPos->nSize) {
        iVar7 = 0;
        do {
          pAVar2 = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PO);
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar2,"miter",pcVar4);
          iVar7 = iVar7 + 1;
        } while (iVar7 < pNtk1->vPos->nSize);
      }
    }
    pVVar6 = pNtk1->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
          pAVar5 = Abc_NtkDupBox(pNtkMiter,pAVar2,0);
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar5,pcVar4,"_1");
          pAVar3 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
          Abc_ObjAssignName(pAVar3,pcVar4,"_1");
          pAVar3 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray])
          ;
          Abc_ObjAssignName(pAVar3,pcVar4,"_1");
          pVVar6 = pNtk1->vBoxes;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar6->nSize);
    }
    pVVar6 = pNtk2->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
          pAVar5 = Abc_NtkDupBox(pNtkMiter,pAVar2,0);
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar5,pcVar4,"_2");
          pAVar3 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
          Abc_ObjAssignName(pAVar3,pcVar4,"_2");
          pAVar3 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray])
          ;
          Abc_ObjAssignName(pAVar3,pcVar4,"_2");
          pVVar6 = pNtk2->vBoxes;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar6->nSize);
    }
  }
  else {
    pVVar6 = pNtk1->vCis;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        pvVar1 = pVVar6->pArray[lVar8];
        pAVar2 = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PI);
        *(Abc_Obj_t **)((long)pvVar1 + 0x40) = pAVar2;
        if (pNtk2->vCis->nSize <= lVar8) {
LAB_002d77f5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar3 = (Abc_Obj_t *)pNtk2->vCis->pArray[lVar8];
        (pAVar3->field_6).pCopy = pAVar2;
        pcVar4 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk1->vCis;
      } while (lVar8 < pVVar6->nSize);
    }
    if (nPartSize < 1) {
      if (fMulti == 0) {
        pAVar2 = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PO);
        Abc_ObjAssignName(pAVar2,"miter",(char *)0x0);
        return;
      }
      if (0 < pNtk1->vCos->nSize) {
        iVar7 = 0;
        do {
          pAVar2 = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PO);
          pcVar4 = Abc_ObjName(pAVar2);
          Abc_ObjAssignName(pAVar2,"miter",pcVar4);
          iVar7 = iVar7 + 1;
        } while (iVar7 < pNtk1->vCos->nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMiterPrepare( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtkMiter, int fComb, int nPartSize, int fMulti )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    // clean the copy field in all objects
//    Abc_NtkCleanCopy( pNtk1 );
//    Abc_NtkCleanCopy( pNtk2 );
    Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
    Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

    if ( fComb )
    {
        // create new PIs and remember them in the old PIs
        Abc_NtkForEachCi( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkCreatePi( pNtkMiter );
            // remember this PI in the old PIs
            pObj->pCopy = pObjNew;
            pObj = Abc_NtkCi(pNtk2, i);  
            pObj->pCopy = pObjNew;
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
        }
        if ( nPartSize <= 0 )
        {
            // create POs
            if ( fMulti )
            {
                Abc_NtkForEachCo( pNtk1, pObj, i )
                {
                    pObjNew = Abc_NtkCreatePo( pNtkMiter );
                    Abc_ObjAssignName( pObjNew, "miter", Abc_ObjName(pObjNew) );
                }

            }
            else
            {
                pObjNew = Abc_NtkCreatePo( pNtkMiter );
                Abc_ObjAssignName( pObjNew, "miter", NULL );
            }
        }
    }
    else
    {
        // create new PIs and remember them in the old PIs
        Abc_NtkForEachPi( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkCreatePi( pNtkMiter );
            // remember this PI in the old PIs
            pObj->pCopy = pObjNew;
            pObj = Abc_NtkPi(pNtk2, i);  
            pObj->pCopy = pObjNew;
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
        }
        if ( nPartSize <= 0 )
        {
            // create POs
            if ( fMulti )
            {
                Abc_NtkForEachPo( pNtk1, pObj, i )
                {
                    pObjNew = Abc_NtkCreatePo( pNtkMiter );
                    Abc_ObjAssignName( pObjNew, "miter", Abc_ObjName(pObjNew) );
                }

            }
            else
            {
                pObjNew = Abc_NtkCreatePo( pNtkMiter );
                Abc_ObjAssignName( pObjNew, "miter", NULL );
            }
        }
        // create the latches
        Abc_NtkForEachLatch( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkDupBox( pNtkMiter, pObj, 0 );
            // add names
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), "_1" );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pObj)), "_1" );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pObj)), "_1" );
        }
        Abc_NtkForEachLatch( pNtk2, pObj, i )
        {
            pObjNew = Abc_NtkDupBox( pNtkMiter, pObj, 0 );
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), "_2" );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pObj)), "_2" );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pObj)), "_2" );
        }
    }
}